

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.hpp
# Opt level: O0

void __thiscall OpenMD::InversePowerSeries::~InversePowerSeries(InversePowerSeries *this)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  *in_RDI = &PTR__InversePowerSeries_00484288;
  std::__cxx11::string::~string((string *)(in_RDI + 0x15));
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x2a1adb);
  std::
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  ::~vector((vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
             *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2a1b05);
  VanDerWaalsInteraction::~VanDerWaalsInteraction((VanDerWaalsInteraction *)0x2a1b0f);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }